

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# combininglock.h
# Opt level: O0

void __thiscall snmalloc::CombiningLockNode::wait<snmalloc::PALLinux>(CombiningLockNode *this)

{
  bool bVar1;
  LockStatus LVar2;
  atomic<snmalloc::CombiningLockNode::LockStatus> *in_RDI;
  memory_order unaff_retaddr;
  LockStatus unaff_retaddr_00;
  LockStatus expected;
  int remaining;
  undefined4 uVar3;
  int iVar4;
  
  for (iVar4 = 100; 0 < iVar4; iVar4 = iVar4 + -1) {
    LVar2 = std::atomic<snmalloc::CombiningLockNode::LockStatus>::load(in_RDI,acquire);
    if (LVar2 != WAITING) {
      return;
    }
    AAL_x86::pause();
  }
  uVar3 = 0;
  bVar1 = std::atomic<snmalloc::CombiningLockNode::LockStatus>::compare_exchange_strong
                    (&this->status,_expected,unaff_retaddr_00,unaff_retaddr);
  if (bVar1) {
    PALLinux::wait_on_address<snmalloc::CombiningLockNode::LockStatus>
              ((Atomic<snmalloc::CombiningLockNode::LockStatus> *)CONCAT44(iVar4,uVar3),
               (LockStatus)((ulong)in_RDI >> 0x20));
    LVar2 = std::atomic<snmalloc::CombiningLockNode::LockStatus>::load(in_RDI,acquire);
    if (LVar2 == SLEEPING) {
      error((char *)0x1124eb);
    }
  }
  return;
}

Assistant:

void wait()
    {
      if constexpr (!use_wait_on_address<Pal>)
      {
        while (status.load(stl::memory_order_acquire) == LockStatus::WAITING)
          Aal::pause();
      }
      else
      {
        int remaining = 100;
        while (remaining > 0)
        {
          if (status.load(stl::memory_order_acquire) != LockStatus::WAITING)
            return;
          Aal::pause();
          remaining--;
        }
        LockStatus expected = LockStatus::WAITING;
        if (status.compare_exchange_strong(
              expected, LockStatus::SLEEPING, stl::memory_order_acq_rel))
        {
          Pal::wait_on_address(status, LockStatus::SLEEPING);
          if (status.load(stl::memory_order_acquire) == LockStatus::SLEEPING)
          {
            error("Corruption in core locking primitive. Aborting execution.");
          }
        }
      }
    }